

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O3

int MPIABI_Fetch_and_op(void *origin_addr,void *result_addr,MPIABI_Datatype datatype,int target_rank
                       ,MPIABI_Aint target_disp,MPIABI_Op op,MPIABI_Win win)

{
  int iVar1;
  
  iVar1 = MPI_Fetch_and_op();
  return iVar1;
}

Assistant:

int MPIABI_Fetch_and_op(
  const void * origin_addr,
  void * result_addr,
  MPIABI_Datatype datatype,
  int target_rank,
  MPIABI_Aint target_disp,
  MPIABI_Op op,
  MPIABI_Win win
) {
  return MPI_Fetch_and_op(
    origin_addr,
    result_addr,
    (MPI_Datatype)(WPI_Datatype)datatype,
    target_rank,
    (MPI_Aint)(WPI_Aint)target_disp,
    (MPI_Op)(WPI_Op)op,
    (MPI_Win)(WPI_Win)win
  );
}